

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServerConsole.cxx
# Opt level: O0

void __thiscall
cmDebugServerConsole::cmDebugServerConsole(cmDebugServerConsole *this,cmDebugger *debugger)

{
  cmConnection *conn;
  cmConnectionBufferStrategy *bufferStrategy;
  cmDebugger *debugger_local;
  cmDebugServerConsole *this_local;
  
  conn = (cmConnection *)operator_new(0x48);
  bufferStrategy = (cmConnectionBufferStrategy *)operator_new(8);
  bufferStrategy->_vptr_cmConnectionBufferStrategy = (_func_int **)0x0;
  cmLineBufferStrategy::cmLineBufferStrategy((cmLineBufferStrategy *)bufferStrategy);
  cmStdIoConnection::cmStdIoConnection((cmStdIoConnection *)conn,bufferStrategy);
  cmDebugServerConsole(this,debugger,conn,true);
  return;
}

Assistant:

cmDebugServerConsole::cmDebugServerConsole(cmDebugger& debugger)
  : cmDebugServerConsole(debugger,
                         new cmStdIoConnection(new cmLineBufferStrategy()))
{
}